

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

void __thiscall
mjs::test_spec_runner::test_spec_runner
          (test_spec_runner *this,gc_heap *h,
          vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,block_statement *statements
          )

{
  version ver;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this->specs_ = specs;
  std::__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)
             &(statements->super_statement).super_syntax_node.extend_);
  ver = tested_version();
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(const_mjs::statement_&,_const_mjs::completion_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp:177:35)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_mjs::statement_&,_const_mjs::completion_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp:177:35)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  interpreter::interpreter(&this->i_,h,ver,(on_statement_executed_type *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  this->index_ = 0;
  this->last_line_ = 0;
  completion::completion(&this->last_result_,(value *)&value::undefined,normal);
  return;
}

Assistant:

explicit test_spec_runner(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements)
        : specs_(specs)
        , source_(statements.extend().file)
        , i_(h, tested_version(), [this](const statement& s, const completion& res) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << s.extend().start << "-" << pos_w << s.extend().end << ": ";
            print(std::wcout, s);
            std::wcout << " ==> " << debug_string(res.result) << "\n";
#endif
            if (s.extend().file == source_ && s.extend().start > last_line_) {
                check_test_spec_done(s.extend().start);
                last_result_ = res;
                last_line_ = s.extend().start;
            }
#if 0 // The stress test should be enabled, but this might still be relevant later on when debugging the GC
            h.garbage_collect(); // Run garbage collection after each statement to help catch bugs
#endif
        })
#ifdef TEST_SPEC_DEBUG
        , heap_(h)
#endif
    {
    }